

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O0

void boost::heap::
     pop_interval_heap_max<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *first,int *last)

{
  difference_type dVar1;
  reference p1;
  reference p2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  undefined1 local_30 [8];
  guard_t scope_guard;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_18._M_current = last;
  last_local._M_current = first;
  dVar1 = __gnu_cxx::operator-(&local_18,&last_local);
  if (2 < dVar1) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
              (&local_18);
    local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&last_local,1);
    p1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                   (&local_38);
    p2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                   (&local_18);
    interval_heap_internal::RAIISwapper<int>::RAIISwapper((RAIISwapper<int> *)local_30,p1,p2);
    std::swap<int>((int *)local_30,scope_guard.ptr1_);
    interval_heap_internal::
    sift_down<false,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
              (last_local._M_current,local_18._M_current,1,2);
    interval_heap_internal::RAIISwapper<int>::disable((RAIISwapper<int> *)local_30);
    interval_heap_internal::RAIISwapper<int>::~RAIISwapper((RAIISwapper<int> *)local_30);
  }
  return;
}

Assistant:

void pop_interval_heap_max (Iterator first, Iterator last, Compare compare) {
  using namespace std;
  using interval_heap_internal::sift_down;
  typedef typename iterator_traits<Iterator>::difference_type Offset;
//  Nothing to be done.
  if (last - first <= 2)
    return;
  --last;
  typedef interval_heap_internal::RAIISwapper<typename std::iterator_traits<Iterator>::value_type> guard_t;
#if (__cplusplus >= 201103L)
  guard_t scope_guard (std::addressof(*(first + 1)), std::addressof(*last));
#else
  guard_t scope_guard (&(*(first + 1)), &(*last));
#endif
  swap(*scope_guard.ptr1_, *scope_guard.ptr2_);
  sift_down<false, Iterator, Offset, Compare>(first, last, 1, compare, 2);
  scope_guard.disable();
}